

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_vsnprintf(char *buf,size_t buflen,char *format,__va_list_tag *ap)

{
  int r;
  __va_list_tag *ap_local;
  char *format_local;
  size_t buflen_local;
  char *buf_local;
  
  if (buflen == 0) {
    buf_local._4_4_ = 0;
  }
  else {
    buf_local._4_4_ = vsnprintf(buf,buflen,format,ap);
    buf[buflen - 1] = '\0';
  }
  return buf_local._4_4_;
}

Assistant:

int
evutil_vsnprintf(char *buf, size_t buflen, const char *format, va_list ap)
{
	int r;
	if (!buflen)
		return 0;
#if defined(_MSC_VER) || defined(_WIN32)
	r = _vsnprintf(buf, buflen, format, ap);
	if (r < 0)
		r = _vscprintf(format, ap);
#elif defined(sgi)
	/* Make sure we always use the correct vsnprintf on IRIX */
	extern int      _xpg5_vsnprintf(char * __restrict,
		__SGI_LIBC_NAMESPACE_QUALIFIER size_t,
		const char * __restrict, /* va_list */ char *);

	r = _xpg5_vsnprintf(buf, buflen, format, ap);
#else
	r = vsnprintf(buf, buflen, format, ap);
#endif
	buf[buflen-1] = '\0';
	return r;
}